

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int GmfSetBlock(int64_t MshIdx,int KwdCod,int64_t BegIdx,int64_t EndIdx,int MapTyp,void *MapTab,
               void *prc,...)

{
  __jmp_buf_tag *__env;
  long lVar1;
  int iVar2;
  ulong uVar3;
  char in_AL;
  int iVar4;
  int iVar5;
  void *pvVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  char *pcVar13;
  uint *puVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong *puVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  __jmp_buf_tag *p_Var23;
  long lVar24;
  double *pdVar25;
  FILE *__stream;
  double *pdVar26;
  double dVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  void *pvVar32;
  ulong uVar33;
  bool bVar34;
  undefined4 in_XMM0_Da;
  float fVar35;
  undefined4 uVar36;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 in_stack_00000010;
  int UsrTyp [1000];
  char *UsrDat [1000];
  int FilTyp [1000];
  size_t UsrLen [1000];
  char *UsrBas [1000];
  ulong *local_7f10;
  aiocb local_7e88;
  ulong local_7e60;
  ulong local_7e58;
  ulong local_7e50;
  ulong local_7e48;
  ulong local_7e40;
  double *local_7e38;
  double *local_7e30;
  double *local_7e28;
  long local_7e20;
  ulong local_7e18;
  ulong local_7e10;
  ulong *local_7e08;
  long local_7e00;
  __jmp_buf_tag *local_7df8;
  long local_7df0;
  ulong local_7de8 [6];
  undefined4 local_7db8;
  undefined8 local_7da8;
  undefined8 local_7d98;
  undefined8 local_7d88;
  undefined8 local_7d78;
  undefined8 local_7d68;
  undefined8 local_7d58;
  undefined8 local_7d48;
  uint auStack_7d38 [1000];
  ulong auStack_6d98 [1000];
  uint auStack_4e58 [1000];
  ulong auStack_3eb8 [1000];
  ulong auStack_1f78 [1001];
  
  iVar5 = (int)_KwdCod;
  if (in_AL != '\0') {
    local_7db8 = in_XMM0_Da;
    local_7da8 = in_XMM1_Qa;
    local_7d98 = in_XMM2_Qa;
    local_7d88 = in_XMM3_Qa;
    local_7d78 = in_XMM4_Qa;
    local_7d68 = in_XMM5_Qa;
    local_7d58 = in_XMM6_Qa;
    local_7d48 = in_XMM7_Qa;
  }
  __env = (__jmp_buf_tag *)(MshIdx + 0x48);
  p_Var23 = __env;
  iVar4 = _setjmp(__env);
  iVar15 = 0;
  if ((0xffffff0f < iVar5 - 0xf1U) && (iVar4 == 0)) {
    lVar1 = MshIdx + (long)iVar5 * 0x3300;
    uVar3 = *(ulong *)(lVar1 + 0x10d8);
    if ((uVar3 != 0) && (iVar15 = 0, (*(uint *)(lVar1 + 0x110) & 0xfffffffe) == 2)) {
      if (MapTyp == 10) {
        pvVar6 = (void *)0x0;
        pvVar32 = MapTab;
      }
      else {
        pvVar32 = (void *)0x0;
        pvVar6 = MapTab;
        if (MapTyp != 0xb) {
          pvVar6 = pvVar32;
        }
      }
      local_7f10 = &stack0x00000010;
      if (prc == (void *)0x0) {
        uVar7 = 0;
      }
      else {
        local_7f10 = (ulong *)&stack0x00000018;
        uVar7 = in_stack_00000010;
      }
      if ((*(uint *)(lVar1 + 0x110) & 0xfffffffe) != 2) {
        longjmp(__env,-0x2a);
      }
      local_7e08 = (ulong *)((long)local_7f10 + 8);
      uVar20 = (uint)*local_7f10;
      local_7e10 = (ulong)uVar20;
      puVar18 = local_7e08;
      if (uVar20 == 100) {
        local_7e10 = *local_7e08;
        local_7e08 = *(ulong **)((long)local_7f10 + 0x10);
        p_Var23 = *(__jmp_buf_tag **)((long)local_7f10 + 0x18);
        _KwdCod = *(long *)((long)local_7f10 + 0x20);
        puVar18 = (ulong *)((long)local_7f10 + 0x28);
      }
      local_7f10 = puVar18;
      iVar5 = *(int *)(lVar1 + 0x11c);
      lVar22 = (long)iVar5;
      if (lVar22 < 1) {
        lVar8 = 0;
      }
      else {
        local_7e18 = uVar3 - 1;
        bVar34 = true;
        uVar33 = 0x30;
        uVar12 = 0x30;
        iVar15 = 0;
        iVar4 = 0;
        uVar16 = uVar20;
        do {
          uVar29 = (uint)uVar33;
          if (uVar20 == 100) {
            lVar8 = (long)iVar15;
            uVar16 = *(uint *)(local_7e10 + lVar8 * 4);
            if ((uVar16 & 0xfffffffc) == 0xc) {
              uVar16 = uVar16 - 4;
              uVar30 = *(uint *)((long)local_7e08 + lVar8 * 4);
            }
            else {
              uVar30 = 1;
              if (uVar16 - 1 < 4) {
                uVar30 = *(uint *)(MshIdx + 0x1c + (ulong)uVar16 * 4);
                uVar16 = *(int *)(MshIdx + 4) == 1 ^ 9;
              }
            }
            uVar31 = p_Var23->__jmpbuf[lVar8];
            puVar18 = (ulong *)(_KwdCod + lVar8 * 8);
            iVar15 = iVar15 + 1;
          }
          else {
            if (!bVar34) {
              uVar17 = (uint)uVar12;
              if (uVar17 < 0x29) {
                uVar17 = uVar17 + 8;
                puVar18 = (ulong *)((long)local_7de8 + uVar12);
                uVar29 = uVar17;
              }
              else {
                puVar18 = local_7f10;
                local_7f10 = local_7f10 + 1;
              }
              uVar16 = (uint)*puVar18;
              uVar12 = (ulong)uVar17;
            }
            uVar17 = (uint)uVar12;
            if ((uVar16 & 0xfffffffc) == 0xc) {
              if (uVar17 < 0x29) {
                uVar17 = uVar17 + 8;
                puVar18 = (ulong *)((long)local_7de8 + uVar12);
                uVar29 = uVar17;
              }
              else {
                puVar18 = local_7f10;
                local_7f10 = local_7f10 + 1;
              }
              uVar16 = uVar16 - 4;
              uVar30 = (uint)*puVar18;
            }
            else {
              uVar30 = 1;
              if (uVar16 - 1 < 4) {
                uVar30 = *(uint *)(MshIdx + 0x1c + (ulong)uVar16 * 4);
                uVar16 = *(int *)(MshIdx + 4) == 1 ^ 9;
              }
            }
            if (uVar17 < 0x29) {
              uVar29 = uVar17 + 8;
              puVar18 = (ulong *)((long)local_7de8 + (ulong)uVar17);
            }
            else {
              puVar18 = local_7f10;
              local_7f10 = local_7f10 + 1;
            }
            uVar33 = (ulong)uVar29;
            uVar31 = *puVar18;
            if (uVar29 < 0x29) {
              puVar18 = (ulong *)((long)local_7de8 + uVar33);
              uVar33 = (ulong)(uVar29 + 8);
            }
            else {
              puVar18 = local_7f10;
              local_7f10 = local_7f10 + 1;
            }
            bVar34 = false;
            uVar12 = uVar33;
          }
          if ((long)uVar3 < 2) {
            uVar9 = 0;
          }
          else {
            uVar9 = (*puVar18 - uVar31) / local_7e18;
          }
          if (0 < (int)uVar30) {
            iVar2 = *(int *)(&DAT_0010c0e0 + (long)(int)uVar16 * 4);
            uVar19 = 0;
            do {
              auStack_7d38[(long)iVar4 + uVar19] = uVar16;
              auStack_1f78[(long)iVar4 + uVar19] = uVar31;
              auStack_6d98[(long)iVar4 + uVar19] = uVar31;
              auStack_3eb8[(long)iVar4 + uVar19] = uVar9;
              uVar19 = uVar19 + 1;
              uVar31 = uVar31 + (long)iVar2;
            } while (uVar30 != uVar19);
            iVar4 = iVar4 + (int)uVar19;
          }
        } while (iVar4 < iVar5);
        lVar24 = 0;
        lVar8 = lVar24;
        local_7df0 = lVar22;
        if (iVar5 < 1) {
          lVar8 = 0;
        }
        else {
          do {
            if (*(char *)(lVar1 + 0x10e8 + lVar24) == 'r') {
              bVar34 = *(int *)(MshIdx + 0x18) != 0x20;
              uVar12 = (ulong)bVar34;
              uVar20 = bVar34 + 8;
            }
            else {
              bVar34 = *(int *)(MshIdx + 4) < 4;
              uVar20 = bVar34 ^ 0xb;
              uVar12 = (ulong)bVar34 ^ 3;
            }
            auStack_4e58[lVar24] = uVar20;
            lVar8 = lVar8 + *(int *)(&DAT_0010c100 + uVar12 * 4);
            lVar24 = lVar24 + 1;
          } while (lVar22 != lVar24);
        }
      }
      local_7e00 = _KwdCod;
      local_7df8 = p_Var23;
      if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
        pdVar10 = (double *)malloc(lVar8 * 10000);
        if (pdVar10 == (double *)0x0) {
          longjmp(__env,-0x2b);
        }
        local_7e20 = lVar8;
        local_7e38 = (double *)malloc(lVar8 * 10000);
        if (local_7e38 == (double *)0x0) {
          longjmp(__env,-0x2c);
        }
        local_7e88.aio_buf = (double *)0x0;
        local_7e88.aio_nbytes = 0;
        local_7e88.aio_lio_opcode = 0;
        local_7e88._36_4_ = 0;
        local_7e88.aio_fildes = *(FILE **)(MshIdx + 0x300410);
        local_7e28 = local_7e38;
        local_7e88.aio_offset = ftell((FILE *)local_7e88.aio_fildes);
        lVar8 = -((long)uVar3 >> 0x3f);
        lVar22 = (long)uVar3 / 10000 + ((long)uVar3 >> 0x3f);
        local_7e40 = lVar22 + lVar8;
        local_7e48 = lVar22 + lVar8 + 1;
        uVar12 = 0;
        pdVar11 = pdVar10;
        uVar31 = uVar12;
        uVar9 = uVar12;
        uVar33 = uVar12;
        local_7e30 = pdVar10;
        do {
          uVar19 = uVar33;
          if (uVar31 != 0) {
            local_7e88.aio_nbytes = uVar9 * local_7e20;
            local_7e58 = uVar9;
            local_7e50 = uVar33;
            iVar5 = my_aio_write(&local_7e88);
            uVar9 = local_7e58;
            uVar19 = local_7e50;
            if (iVar5 == -1) {
              printf("aio_fildes = %p\n",local_7e88.aio_fildes);
              printf("aio_buf    = %p\n",local_7e88.aio_buf);
              printf("aio_offset = %ld\n",local_7e88.aio_offset);
              printf("aio_nbytes = %ld\n",local_7e88.aio_nbytes);
              puVar14 = (uint *)__errno_location();
              printf("errno      = %d\n",(ulong)*puVar14);
              longjmp(__env,-0x2d);
            }
          }
          if (local_7e40 < uVar31) {
LAB_0010a02a:
            if (local_7e88.aio_lio_opcode != 0) {
              if (local_7e88.aio_lio_opcode != 0x73) {
                pcVar13 = strerror(local_7e88.aio_lio_opcode);
                printf(" Error at aio_error() : %s\n",pcVar13);
                longjmp(__env,-0x2e);
              }
              do {
              } while( true );
            }
            local_7e88.aio_offset = local_7e88.aio_offset + local_7e88.aio_nbytes;
            uVar33 = uVar19;
          }
          else {
            uVar9 = uVar31 * -10000 + uVar3;
            uVar21 = 10000;
            if (uVar31 == local_7e40) {
              uVar21 = uVar9;
            }
            uVar33 = uVar21 + uVar19;
            if (prc != (void *)0x0) {
              local_7e60 = uVar9;
              (*(code *)prc)(uVar19 + 1,uVar33,uVar7);
              uVar9 = local_7e60;
            }
            if (0 < (long)uVar21) {
              iVar5 = *(int *)(lVar1 + 0x11c);
              uVar28 = 0;
              uVar19 = uVar12;
              pdVar25 = pdVar11;
              do {
                uVar12 = uVar19 + 1;
                if (0 < iVar5) {
                  lVar22 = 0;
                  do {
                    if (pvVar32 == (void *)0x0) {
                      if (pvVar6 != (void *)0x0) {
                        lVar8 = *(long *)((long)pvVar6 + uVar12 * 8);
                        goto LAB_00109f19;
                      }
                      lVar8 = auStack_3eb8[lVar22] * uVar19;
                    }
                    else {
                      lVar8 = (long)*(int *)((long)pvVar32 + uVar12 * 4);
LAB_00109f19:
                      lVar8 = (lVar8 + -1) * auStack_3eb8[lVar22];
                    }
                    pdVar26 = (double *)(lVar8 + auStack_1f78[lVar22]);
                    auStack_6d98[lVar22] = (ulong)pdVar26;
                    switch(auStack_4e58[lVar22]) {
                    case 8:
                      if (auStack_7d38[lVar22] == 8) {
                        fVar35 = *(float *)pdVar26;
                      }
                      else {
                        fVar35 = (float)*pdVar26;
                      }
                      *(float *)pdVar25 = fVar35;
                      break;
                    case 9:
                      if (auStack_7d38[lVar22] == 9) {
                        dVar27 = *pdVar26;
                      }
                      else {
                        dVar27 = (double)*(float *)pdVar26;
                      }
                      *pdVar25 = dVar27;
                      break;
                    case 10:
                      *(float *)pdVar25 = *(float *)pdVar26;
                      break;
                    case 0xb:
                      if (auStack_7d38[lVar22] == 0xb) {
                        dVar27 = *pdVar26;
                      }
                      else {
                        dVar27 = (double)(long)(int)*(float *)pdVar26;
                      }
                      *pdVar25 = dVar27;
                    }
                    pdVar25 = (double *)
                              ((long)pdVar25 +
                              (long)*(int *)(&DAT_0010c0e0 + (long)(int)auStack_4e58[lVar22] * 4));
                    lVar22 = lVar22 + 1;
                    iVar5 = *(int *)(lVar1 + 0x11c);
                  } while (lVar22 < iVar5);
                }
                uVar28 = uVar28 + 1;
                uVar19 = uVar12;
                uVar9 = uVar21;
              } while (uVar28 != uVar21);
            }
            uVar19 = uVar33;
            if (uVar31 != 0) goto LAB_0010a02a;
          }
          bVar34 = pdVar11 == pdVar10;
          pdVar11 = pdVar10;
          local_7e88.aio_buf = local_7e38;
          if (bVar34) {
            pdVar11 = local_7e38;
            local_7e88.aio_buf = pdVar10;
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 <= local_7e48);
        fseek(*(FILE **)(MshIdx + 0x300410),local_7e88.aio_offset,0);
        free(local_7e30);
        free(local_7e28);
      }
      else {
        if (prc != (void *)0x0) {
          (*(code *)prc)(1,*(undefined8 *)(lVar1 + 0x10d8),uVar7);
        }
        uVar12 = (ulong)*(uint *)(lVar1 + 0x11c);
        uVar33 = 1;
        do {
          if (0 < (int)uVar12) {
            lVar22 = 0;
            do {
              switch(auStack_7d38[lVar22]) {
              case 8:
                __stream = *(FILE **)(MshIdx + 0x300410);
                uVar36 = SUB84((double)*(float *)auStack_6d98[lVar22],0);
                pcVar13 = "%.9g";
                goto LAB_0010a1a9;
              case 9:
                __stream = *(FILE **)(MshIdx + 0x300410);
                uVar36 = (undefined4)*(undefined8 *)auStack_6d98[lVar22];
                pcVar13 = "%.17g";
LAB_0010a1a9:
                fprintf(__stream,pcVar13,uVar36);
                break;
              case 10:
                fprintf(*(FILE **)(MshIdx + 0x300410),"%d",(ulong)*(uint *)auStack_6d98[lVar22]);
                break;
              case 0xb:
                fprintf(*(FILE **)(MshIdx + 0x300410),"%lld",*(undefined8 *)auStack_6d98[lVar22]);
              }
              iVar5 = 10;
              if (lVar22 < (long)*(int *)(lVar1 + 0x11c) + -1) {
                iVar5 = 0x20;
              }
              fputc(iVar5,*(FILE **)(MshIdx + 0x300410));
              if (pvVar32 == (void *)0x0) {
                uVar12 = uVar33;
                if (pvVar6 != (void *)0x0) {
                  uVar12 = *(ulong *)((long)pvVar6 + uVar33 * 8);
                }
              }
              else {
                uVar12 = (long)*(int *)((long)pvVar32 + uVar33 * 4);
              }
              auStack_6d98[lVar22] = auStack_1f78[lVar22] + uVar12 * auStack_3eb8[lVar22];
              lVar22 = lVar22 + 1;
              uVar12 = (ulong)*(int *)(lVar1 + 0x11c);
            } while (lVar22 < (long)uVar12);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 <= uVar3);
      }
      iVar15 = 1;
    }
  }
  return iVar15;
}

Assistant:

int GmfSetBlock(  int64_t MshIdx, int KwdCod, int64_t BegIdx, int64_t EndIdx,
                  int MapTyp, void *MapTab, void *prc, ... )
{
   char        *UsrDat[ GmfMaxTyp ], *UsrBas[ GmfMaxTyp ];
   char        *StrTab[4] = {"%.9g", "%.17g", "%d", "%lld" }, *FilPos;
   char        *FilBuf = NULL, *FrtBuf = NULL, *BckBuf = NULL;
   char        **BegTab, **EndTab, *BegUsrDat, *EndUsrDat;
   int         i, j, *FilPtrI32, *UsrPtrI32, FilTyp[ GmfMaxTyp ];
   int         UsrTyp[ GmfMaxTyp ], TypSiz[4] = {4,8,4,8};
   int         err, *IntMapTab = NULL, typ, mod = GmfArgLst;
   int         *TypTab, *SizTab, IniFlg = 1, TotSiz = 0, VecCnt, ArgCnt = 0;
   float       *FilPtrR32, *UsrPtrR32;
   double      *FilPtrR64, *UsrPtrR64;
   int64_t     UsrNmbLin, BlkNmbLin = 0, BlkBegIdx, BlkEndIdx = 0;
   int64_t     *FilPtrI64, *UsrPtrI64, *LngMapTab = NULL, OldIdx = 0;
   size_t      FilBegIdx = BegIdx, FilEndIdx = EndIdx;
   void        (*UsrPrc)(int64_t, int64_t, void *) = NULL;
   size_t      UsrLen[ GmfMaxTyp ], ret, LinSiz, VecLen, s, b, NmbBlk;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];
   struct      aiocb aio;
   char        *UsrArg = NULL;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(FilBuf)
         free(FilBuf);

      return(0);
   }

   // Check mesh and keyword
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) || !kwd->NmbLin )
      return(0);

   // Make sure it's not a simple information keyword
   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      return(0);

   // Temporarily overwright the given begin and end values
   // as arbitrary position block write is not yet implemented
   FilBegIdx = 1;
   FilEndIdx = kwd->NmbLin;

   // Check user's bounds
   if( (FilBegIdx < 1) || (FilBegIdx > FilEndIdx) || (FilEndIdx > (size_t)kwd->NmbLin) )
      return(0);

   // Compute the number of lines to be written
   UsrNmbLin = FilEndIdx - FilBegIdx + 1;

   // Get the renumbering map if any
   if(MapTyp == GmfInt)
      IntMapTab = (int *)MapTab;
   else if(MapTyp == GmfLong)
      LngMapTab = (int64_t *)MapTab;

   // Start decoding the arguments
   va_start(VarArg, prc);
   LinSiz = 0;

   // Get the user's postprocessing procedure and argument adresses, if any
   if(prc)
   {
      UsrPrc = (void (*)(int64_t, int64_t, void *))prc;
      UsrArg = va_arg(VarArg, void *);
   }

   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      longjmp(msh->err, -42);

   // Read the first data type to select between list and table mode
   typ = va_arg(VarArg, int);

   // If the table mode is selected, read the four additional tables
   // containing the arguments: type, vector size, begin and end pointers
   if(typ == GmfArgTab)
   {
      mod = GmfArgTab;
      TypTab = va_arg(VarArg, int *);
      SizTab = va_arg(VarArg, int *);
      BegTab = va_arg(VarArg, char **);
      EndTab = va_arg(VarArg, char **);
   }

   // Read the arguments until to total size reaches the keyword's size
   while(TotSiz < kwd->SolSiz)
   {
      // In list mode all arguments are read from the variable argument buffer
      if(mod == GmfArgLst)
      {
         // Do not read the type argument for the first iteration because
         // it was read befeore the loop begins to get the argument mode
         if(IniFlg)
            IniFlg = 0;
         else
            typ = va_arg(VarArg, int);

         // In case the type is a vector. get its size and change the type
         // for the corresponding scalar type
         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = va_arg(VarArg, int);
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            //  to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = va_arg(VarArg, char *);
         EndUsrDat = va_arg(VarArg, char *);
      }
      else
      {
         // Do exactly the same as above but the arguments are read from
         // the tables instead of VarArgs
         typ = TypTab[ ArgCnt ];

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = SizTab[ ArgCnt ];
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            // to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = (char *)BegTab[ ArgCnt ];
         EndUsrDat = (char *)EndTab[ ArgCnt ];
         ArgCnt++;
      }

      if(UsrNmbLin > 1)
      {
         VecLen = EndUsrDat - BegUsrDat;
         VecLen /= UsrNmbLin - 1;
      }
      else
         VecLen = 0;

      // Compute the consecutive begin / end adresses for vector data types
      for(i=0;i<VecCnt;i++)
      {
         UsrTyp[ TotSiz ]  = typ;
         UsrBas[ TotSiz ]  = BegUsrDat + i * TypSiz[ typ - GmfFloat ];
         UsrDat[ TotSiz ]  = UsrBas[ TotSiz ];
         UsrLen[ TotSiz ]  = VecLen;
         TotSiz++;
      }
   }

   // Get the file's data type
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
         if(msh->FltSiz == 32)
            FilTyp[i] = GmfFloat;
         else
            FilTyp[i] = GmfDouble;
      else
         if(msh->ver <= 3)
            FilTyp[i] = GmfInt;
         else
            FilTyp[i] = GmfLong;

      // Compute the file stride
      LinSiz += TypSiz[ FilTyp[i] - GmfFloat ];
   }

   va_end(VarArg);

   // Write the whole kwd data
   if(msh->typ & Asc)
   {
      if(UsrPrc)
         UsrPrc(1, kwd->NmbLin, UsrArg);

      for(s=FilBegIdx; s<=FilEndIdx; s++)
         for(j=0;j<kwd->SolSiz;j++)
         {
            if(UsrTyp[j] == GmfFloat)
            {
               UsrPtrR32 = (float *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], (double)*UsrPtrR32);
            }
            else if(UsrTyp[j] == GmfDouble)
            {
               UsrPtrR64 = (double *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrR64);
            }
            else if(UsrTyp[j] == GmfInt)
            {
               UsrPtrI32 = (int *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrI32);
            }
            else if(UsrTyp[j] == GmfLong)
            {
               UsrPtrI64 = (int64_t *)UsrDat[j];
               fprintf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], *UsrPtrI64);
            }

            if(j < kwd->SolSiz -1)
               fprintf(msh->hdl, " ");
            else
               fprintf(msh->hdl, "\n");

            //UsrDat[j] += UsrLen[j];
            if(IntMapTab)
               UsrDat[j] = UsrBas[j] + IntMapTab[s] * UsrLen[j];
            else if(LngMapTab)
               UsrDat[j] = UsrBas[j] + LngMapTab[s] * UsrLen[j];
            else
               UsrDat[j] = UsrBas[j] + s * UsrLen[j];
         }
   }
   else
   {
      // Allocate the front and back buffers
      if(!(BckBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -43);

      if(!(FrtBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -44);

      // Setup the asynchronous parameters
      memset(&aio, 0, sizeof(struct aiocb));
      FilBuf = BckBuf;
#ifdef WITH_GMF_AIO
      aio.aio_fildes = msh->FilDes;
#else
      aio.aio_fildes = msh->hdl;
#endif
      aio.aio_offset = (size_t)GetFilPos(msh);

      NmbBlk = UsrNmbLin / BufSiz;

      // Loop over N+1 blocks
      for(b=0;b<=NmbBlk+1;b++)
      {
         // Launch an asynchronous block write
         // except for the first loop iteration
         if(b)
         {
            aio.aio_nbytes = BlkNmbLin * LinSiz;
            
            if(my_aio_write(&aio) == -1)
            {
#ifdef WITH_GMF_AIO
               printf("aio_fildes = %d\n",aio.aio_fildes);
#else
               printf("aio_fildes = %p\n",aio.aio_fildes);
#endif
               printf("aio_buf    = %p\n",aio.aio_buf);
               printf("aio_offset = " INT64_T_FMT "\n",(int64_t)aio.aio_offset);
               printf("aio_nbytes = " INT64_T_FMT "\n",(int64_t)aio.aio_nbytes);
               printf("errno      = %d\n",errno);
               longjmp(msh->err, -45);
            }
         }

         // Parse the block data except at the last loop iteration
         if(b<=NmbBlk)
         {
            // The last block is shorter
            if(b == NmbBlk)
               BlkNmbLin = UsrNmbLin - b * BufSiz;
            else
               BlkNmbLin = BufSiz;

            FilPos = FilBuf;
            BlkBegIdx = BlkEndIdx+1;
            BlkEndIdx += BlkNmbLin;

            // Call user's preprocessing first
            if(UsrPrc)
               UsrPrc(BlkBegIdx, BlkEndIdx, UsrArg);

            // Then copy it's data to the file buffer
            for(i=0;i<BlkNmbLin;i++)
            {
               OldIdx++;

               for(j=0;j<kwd->SolSiz;j++)
               {
                  if(IntMapTab)
                     UsrDat[j] = UsrBas[j] + (IntMapTab[ OldIdx ] - 1) * UsrLen[j];
                  else if(LngMapTab)
                     UsrDat[j] = UsrBas[j] + (LngMapTab[ OldIdx ] - 1) * UsrLen[j];
                  else
                     UsrDat[j] = UsrBas[j] + (OldIdx - 1) * UsrLen[j];

                  if(FilTyp[j] == GmfInt)
                  {
                     FilPtrI32 = (int *)FilPos;

                     if(UsrTyp[j] == GmfInt)
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *FilPtrI32 = *UsrPtrI32;
                     }
                     else
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *FilPtrI32 = (int)*UsrPtrI64;
                     }
                  }
                  else if(FilTyp[j] == GmfLong)
                  {
                     FilPtrI64 = (int64_t *)FilPos;

                     if(UsrTyp[j] == GmfLong)
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *FilPtrI64 = *UsrPtrI64;
                     }
                     else
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *FilPtrI64 = (int64_t)*UsrPtrI32;
                     }
                  }
                  else if(FilTyp[j] == GmfFloat)
                  {
                     FilPtrR32 = (float *)FilPos;

                     if(UsrTyp[j] == GmfFloat)
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *FilPtrR32 = *UsrPtrR32;
                     }
                     else
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *FilPtrR32 = (float)*UsrPtrR64;
                     }
                  }
                  else if(FilTyp[j] == GmfDouble)
                  {
                     FilPtrR64 = (double *)FilPos;

                     if(UsrTyp[j] == GmfDouble)
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *FilPtrR64 = *UsrPtrR64;
                     }
                     else
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *FilPtrR64 = (double)*UsrPtrR32;
                     }
                  }

                  FilPos += TypSiz[ FilTyp[j] - GmfFloat ];
               }
            }
         }

         // Wait for write completion execpt at the first loop iteration
         if(b)
         {
            while(my_aio_error(&aio) == EINPROGRESS);

            err = my_aio_error(&aio);
            ret = my_aio_return(&aio);

            if (err != 0) {
              printf (" Error at aio_error() : %s\n", strerror (err));
              longjmp(msh->err, -46);
            }

            if (ret != aio.aio_nbytes) {
              printf(" Error at aio_return()\n");
              longjmp(msh->err, -47);
            }

            // Move the write position
            aio.aio_offset += (size_t)aio.aio_nbytes;
         }

         // Swap the buffers
         if(FilBuf == BckBuf)
         {
            aio.aio_buf = BckBuf;
            FilBuf = FrtBuf;
         }
         else
         {
            aio.aio_buf = FrtBuf;
            FilBuf = BckBuf;
         }
      }

      SetFilPos(msh, aio.aio_offset);
      free(BckBuf);
      free(FrtBuf);
   }

   return(1);
}